

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.h
# Opt level: O3

void __thiscall gutil::Parameter::nextValue<double>(Parameter *this,double *v)

{
  IOException *this_00;
  string s;
  istringstream in;
  string local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  double local_1a0 [4];
  byte abStack_180 [88];
  ios_base local_128 [264];
  
  local_1e0._M_string_length = 0;
  local_1e0.field_2._M_local_buf[0] = '\0';
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  nextString(this,&local_1e0,(char *)0x0);
  std::__cxx11::istringstream::istringstream((istringstream *)local_1a0,(string *)&local_1e0,_S_in);
  std::istream::_M_extract<double>(local_1a0);
  if ((abStack_180[*(long *)((long)local_1a0[0] + -0x18)] & 5) == 0) {
    std::__cxx11::istringstream::~istringstream((istringstream *)local_1a0);
    std::ios_base::~ios_base(local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p);
    }
    return;
  }
  this_00 = (IOException *)__cxa_allocate_exception(0x28);
  std::operator+(&local_1c0,"Format error of argument: ",&local_1e0);
  IOException::IOException(this_00,&local_1c0);
  __cxa_throw(this_00,&IOException::typeinfo,Exception::~Exception);
}

Assistant:

void nextValue(T &v)
    {
      std::string s;

      nextString(s);

      std::istringstream in(s);
      in >> v;

      if (in.fail())
      {
        throw IOException("Format error of argument: "+s);
      }
    }